

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error ft_var_load_item_variation_store(TT_Face face,FT_ULong offset,GX_ItemVarStore itemStore)

{
  FT_Memory memory;
  uint uVar1;
  FT_Char FVar2;
  FT_UShort FVar3;
  FT_UShort FVar4;
  FT_UShort FVar5;
  uint uVar6;
  FT_ULong FVar7;
  FT_Pointer P;
  FT_ULong FVar8;
  FT_Pointer pvVar9;
  uint uVar10;
  uint *in_RCX;
  ulong uVar11;
  uint *puVar12;
  uint uVar13;
  long *plVar14;
  ulong local_70;
  uint local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  FT_Error local_34 [2];
  FT_Error error;
  
  memory = *(FT_Memory *)&(face->root).num_fixed_sizes;
  local_34[0] = FT_Stream_Seek((FT_Stream)face,(FT_ULong)itemStore);
  if (local_34[0] == 0) {
    FVar3 = FT_Stream_ReadUShort((FT_Stream)face,local_34);
    if (local_34[0] == 0) {
      if (FVar3 == 1) {
        FVar7 = FT_Stream_ReadULong((FT_Stream)face,local_34);
        if (local_34[0] == 0) {
          FVar3 = FT_Stream_ReadUShort((FT_Stream)face,local_34);
          *in_RCX = (uint)FVar3;
          if (local_34[0] == 0) {
            if (FVar3 != 0) {
              P = ft_mem_realloc(memory,8,0,(ulong)FVar3,(void *)0x0,local_34);
              if (local_34[0] == 0) {
                if (*in_RCX != 0) {
                  uVar11 = 0;
                  do {
                    FVar8 = FT_Stream_ReadULong((FT_Stream)face,local_34);
                    *(FT_ULong *)((long)P + uVar11 * 8) = FVar8;
                    if (local_34[0] != 0) goto LAB_0022970b;
                    uVar11 = uVar11 + 1;
                  } while (uVar11 < *in_RCX);
                }
                local_34[0] = FT_Stream_Seek((FT_Stream)face,(long)&itemStore->dataCount + FVar7);
                if (local_34[0] == 0) {
                  FVar3 = FT_Stream_ReadUShort((FT_Stream)face,local_34);
                  *(FT_UShort *)(in_RCX + 4) = FVar3;
                  if (local_34[0] == 0) {
                    FVar3 = FT_Stream_ReadUShort((FT_Stream)face,local_34);
                    in_RCX[5] = (uint)FVar3;
                    if (local_34[0] == 0) {
                      if (**(uint **)(offset + 0x18) == (uint)(ushort)in_RCX[4]) {
                        pvVar9 = ft_mem_realloc(memory,8,0,(ulong)FVar3,(void *)0x0,local_34);
                        *(FT_Pointer *)(in_RCX + 6) = pvVar9;
                        if (local_34[0] == 0) {
                          if (in_RCX[5] != 0) {
                            uVar11 = (ulong)(ushort)in_RCX[4];
                            local_58 = 0;
                            do {
                              pvVar9 = ft_mem_realloc(memory,0x18,0,uVar11,(void *)0x0,local_34);
                              *(FT_Pointer *)(*(long *)(in_RCX + 6) + local_58 * 8) = pvVar9;
                              if (local_34[0] != 0) goto LAB_0022970b;
                              if ((short)in_RCX[4] == 0) {
                                uVar11 = 0;
                              }
                              else {
                                plVar14 = (long *)((long)pvVar9 + 0x10);
                                local_50 = 0;
                                do {
                                  FVar3 = FT_Stream_ReadUShort((FT_Stream)face,local_34);
                                  if (((local_34[0] != 0) ||
                                      (FVar4 = FT_Stream_ReadUShort((FT_Stream)face,local_34),
                                      local_34[0] != 0)) ||
                                     (FVar5 = FT_Stream_ReadUShort((FT_Stream)face,local_34),
                                     local_34[0] != 0)) goto LAB_0022970b;
                                  plVar14[-2] = (long)(short)FVar3 << 2;
                                  plVar14[-1] = (long)(short)FVar4 << 2;
                                  *plVar14 = (long)(short)FVar5 << 2;
                                  local_50 = local_50 + 1;
                                  uVar11 = (ulong)(ushort)in_RCX[4];
                                  plVar14 = plVar14 + 3;
                                } while (local_50 < uVar11);
                              }
                              local_58 = local_58 + 1;
                            } while (local_58 < in_RCX[5]);
                          }
                          pvVar9 = ft_mem_realloc(memory,0x18,0,(ulong)*in_RCX,(void *)0x0,local_34)
                          ;
                          *(FT_Pointer *)(in_RCX + 2) = pvVar9;
                          if ((local_34[0] == 0) && (*in_RCX != 0)) {
                            local_70 = 0;
                            while( true ) {
                              puVar12 = (uint *)(local_70 * 0x18 + *(long *)(in_RCX + 2));
                              local_34[0] = FT_Stream_Seek((FT_Stream)face,
                                                           (long)&itemStore->dataCount +
                                                           *(long *)((long)P + local_70 * 8));
                              if (local_34[0] != 0) break;
                              FVar3 = FT_Stream_ReadUShort((FT_Stream)face,local_34);
                              *puVar12 = (uint)FVar3;
                              if ((local_34[0] != 0) ||
                                 (FVar3 = FT_Stream_ReadUShort((FT_Stream)face,local_34),
                                 local_34[0] != 0)) break;
                              FVar4 = FT_Stream_ReadUShort((FT_Stream)face,local_34);
                              puVar12[1] = (uint)FVar4;
                              if (local_34[0] != 0) break;
                              if ((FVar4 < FVar3) || (in_RCX[5] < (uint)FVar4)) {
LAB_00229b28:
                                local_34[0] = 8;
                                break;
                              }
                              pvVar9 = ft_mem_realloc(memory,4,0,(ulong)FVar4,(void *)0x0,local_34);
                              *(FT_Pointer *)(puVar12 + 2) = pvVar9;
                              if (local_34[0] != 0) break;
                              if (puVar12[1] == 0) {
                                uVar6 = 0;
                              }
                              else {
                                uVar11 = 0;
                                do {
                                  FVar4 = FT_Stream_ReadUShort((FT_Stream)face,local_34);
                                  *(uint *)(*(long *)(puVar12 + 2) + uVar11 * 4) = (uint)FVar4;
                                  if (local_34[0] != 0) goto LAB_0022970b;
                                  if (in_RCX[5] < (uint)FVar4 || in_RCX[5] == (uint)FVar4)
                                  goto LAB_00229b28;
                                  uVar11 = uVar11 + 1;
                                  uVar6 = puVar12[1];
                                } while (uVar11 < uVar6);
                              }
                              pvVar9 = ft_mem_realloc(memory,2,0,(ulong)(uVar6 * *puVar12),
                                                      (void *)0x0,local_34);
                              *(FT_Pointer *)(puVar12 + 4) = pvVar9;
                              if (local_34[0] != 0) break;
                              uVar6 = puVar12[1];
                              if (*puVar12 * uVar6 != 0) {
                                local_60 = 0;
                                do {
                                  uVar10 = (uint)local_60;
                                  uVar1 = (uint)FVar3;
                                  local_64 = uVar10;
                                  if (FVar3 != 0) {
                                    local_64 = uVar10 + uVar1;
                                    uVar6 = uVar1;
                                    do {
                                      FVar4 = FT_Stream_ReadUShort((FT_Stream)face,local_34);
                                      if (local_34[0] != 0) goto LAB_0022970b;
                                      *(FT_UShort *)(*(long *)(puVar12 + 4) + local_60 * 2) = FVar4;
                                      local_60 = (ulong)((int)local_60 + 1);
                                      uVar6 = uVar6 - 1;
                                    } while (uVar6 != 0);
                                    uVar6 = puVar12[1];
                                  }
                                  uVar13 = (uint)FVar3;
                                  if (uVar1 < uVar6) {
                                    do {
                                      FVar2 = FT_Stream_ReadChar((FT_Stream)face,local_34);
                                      if (local_34[0] != 0) goto LAB_0022970b;
                                      *(short *)(*(long *)(puVar12 + 4) +
                                                (ulong)(uVar10 + uVar13) * 2) = (short)FVar2;
                                      uVar13 = uVar13 + 1;
                                      uVar6 = puVar12[1];
                                    } while (uVar13 < uVar6);
                                    local_64 = uVar10 + uVar13;
                                  }
                                  local_60 = (ulong)local_64;
                                } while (local_64 < *puVar12 * uVar6);
                              }
                              local_70 = local_70 + 1;
                              if (*in_RCX <= local_70) break;
                            }
                          }
                        }
                      }
                      else {
                        local_34[0] = 8;
                      }
                    }
                  }
                }
              }
              goto LAB_0022970b;
            }
            goto LAB_00229701;
          }
        }
      }
      else {
LAB_00229701:
        local_34[0] = 8;
      }
    }
  }
  P = (void *)0x0;
LAB_0022970b:
  ft_mem_free(memory,P);
  return local_34[0];
}

Assistant:

static FT_Error
  ft_var_load_item_variation_store( TT_Face          face,
                                    FT_ULong         offset,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    FT_Error   error;
    FT_UShort  format;
    FT_ULong   region_offset;
    FT_UInt    i, j, k;
    FT_UInt    shortDeltaCount;

    GX_Blend        blend = face->blend;
    GX_ItemVarData  varData;

    FT_ULong*  dataOffsetArray = NULL;


    if ( FT_STREAM_SEEK( offset ) ||
         FT_READ_USHORT( format ) )
      goto Exit;

    if ( format != 1 )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store: bad store format %d\n",
                  format ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* read top level fields */
    if ( FT_READ_ULONG( region_offset )         ||
         FT_READ_USHORT( itemStore->dataCount ) )
      goto Exit;

    /* we need at least one entry in `itemStore->varData' */
    if ( !itemStore->dataCount )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store: missing varData\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* make temporary copy of item variation data offsets; */
    /* we will parse region list first, then come back     */
    if ( FT_NEW_ARRAY( dataOffsetArray, itemStore->dataCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->dataCount; i++ )
    {
      if ( FT_READ_ULONG( dataOffsetArray[i] ) )
        goto Exit;
    }

    /* parse array of region records (region list) */
    if ( FT_STREAM_SEEK( offset + region_offset ) )
      goto Exit;

    if ( FT_READ_USHORT( itemStore->axisCount )   ||
         FT_READ_USHORT( itemStore->regionCount ) )
      goto Exit;

    if ( itemStore->axisCount != (FT_Long)blend->mmvar->num_axis )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store:"
                  " number of axes in item variation store\n"
                  "                                 "
                  " and `fvar' table are different\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_NEW_ARRAY( itemStore->varRegionList, itemStore->regionCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->regionCount; i++ )
    {
      GX_AxisCoords  axisCoords;


      if ( FT_NEW_ARRAY( itemStore->varRegionList[i].axisList,
                         itemStore->axisCount ) )
        goto Exit;

      axisCoords = itemStore->varRegionList[i].axisList;

      for ( j = 0; j < itemStore->axisCount; j++ )
      {
        FT_Short  start, peak, end;


        if ( FT_READ_SHORT( start ) ||
             FT_READ_SHORT( peak )  ||
             FT_READ_SHORT( end )   )
          goto Exit;

        axisCoords[j].startCoord = FT_fdot14ToFixed( start );
        axisCoords[j].peakCoord  = FT_fdot14ToFixed( peak );
        axisCoords[j].endCoord   = FT_fdot14ToFixed( end );
      }
    }

    /* end of region list parse */

    /* use dataOffsetArray now to parse varData items */
    if ( FT_NEW_ARRAY( itemStore->varData, itemStore->dataCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->dataCount; i++ )
    {
      varData = &itemStore->varData[i];

      if ( FT_STREAM_SEEK( offset + dataOffsetArray[i] ) )
        goto Exit;

      if ( FT_READ_USHORT( varData->itemCount )      ||
           FT_READ_USHORT( shortDeltaCount )         ||
           FT_READ_USHORT( varData->regionIdxCount ) )
        goto Exit;

      /* check some data consistency */
      if ( shortDeltaCount > varData->regionIdxCount )
      {
        FT_TRACE2(( "bad short count %d or region count %d\n",
                    shortDeltaCount,
                    varData->regionIdxCount ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      if ( varData->regionIdxCount > itemStore->regionCount )
      {
        FT_TRACE2(( "inconsistent regionCount %d in varData[%d]\n",
                    varData->regionIdxCount,
                    i ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      /* parse region indices */
      if ( FT_NEW_ARRAY( varData->regionIndices,
                         varData->regionIdxCount ) )
        goto Exit;

      for ( j = 0; j < varData->regionIdxCount; j++ )
      {
        if ( FT_READ_USHORT( varData->regionIndices[j] ) )
          goto Exit;

        if ( varData->regionIndices[j] >= itemStore->regionCount )
        {
          FT_TRACE2(( "bad region index %d\n",
                      varData->regionIndices[j] ));
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }

      /* Parse delta set.                                                */
      /*                                                                 */
      /* On input, deltas are (shortDeltaCount + regionIdxCount) bytes   */
      /* each; on output, deltas are expanded to `regionIdxCount' shorts */
      /* each.                                                           */
      if ( FT_NEW_ARRAY( varData->deltaSet,
                         varData->regionIdxCount * varData->itemCount ) )
        goto Exit;

      /* the delta set is stored as a 2-dimensional array of shorts; */
      /* sign-extend signed bytes to signed shorts                   */
      for ( j = 0; j < varData->itemCount * varData->regionIdxCount; )
      {
        for ( k = 0; k < shortDeltaCount; k++, j++ )
        {
          /* read the short deltas */
          FT_Short  delta;


          if ( FT_READ_SHORT( delta ) )
            goto Exit;

          varData->deltaSet[j] = delta;
        }

        for ( ; k < varData->regionIdxCount; k++, j++ )
        {
          /* read the (signed) byte deltas */
          FT_Char  delta;


          if ( FT_READ_CHAR( delta ) )
            goto Exit;

          varData->deltaSet[j] = delta;
        }
      }
    }

  Exit:
    FT_FREE( dataOffsetArray );

    return error;
  }